

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplify.cc
# Opt level: O0

bool re2::CoalesceWalker::CanCoalesce(Regexp *r1,Regexp *r2)

{
  int iVar1;
  Regexp *a;
  bool bVar2;
  RegexpOp RVar3;
  Rune RVar4;
  ParseFlags PVar5;
  ParseFlags PVar6;
  Regexp **ppRVar7;
  Rune *pRVar8;
  Regexp *r2_local;
  Regexp *r1_local;
  
  RVar3 = Regexp::op(r1);
  if ((((RVar3 == kRegexpStar) || (RVar3 = Regexp::op(r1), RVar3 == kRegexpPlus)) ||
      (RVar3 = Regexp::op(r1), RVar3 == kRegexpQuest)) ||
     (RVar3 = Regexp::op(r1), RVar3 == kRegexpRepeat)) {
    ppRVar7 = Regexp::sub(r1);
    RVar3 = Regexp::op(*ppRVar7);
    if (RVar3 != kRegexpLiteral) {
      ppRVar7 = Regexp::sub(r1);
      RVar3 = Regexp::op(*ppRVar7);
      if (RVar3 != kRegexpCharClass) {
        ppRVar7 = Regexp::sub(r1);
        RVar3 = Regexp::op(*ppRVar7);
        if (RVar3 != kRegexpAnyChar) {
          ppRVar7 = Regexp::sub(r1);
          RVar3 = Regexp::op(*ppRVar7);
          if (RVar3 != kRegexpAnyByte) {
            return false;
          }
        }
      }
    }
    RVar3 = Regexp::op(r2);
    if (((RVar3 == kRegexpStar) || (RVar3 = Regexp::op(r2), RVar3 == kRegexpPlus)) ||
       ((RVar3 = Regexp::op(r2), RVar3 == kRegexpQuest ||
        (RVar3 = Regexp::op(r2), RVar3 == kRegexpRepeat)))) {
      ppRVar7 = Regexp::sub(r1);
      a = *ppRVar7;
      ppRVar7 = Regexp::sub(r2);
      bVar2 = Regexp::Equal(a,*ppRVar7);
      if (bVar2) {
        PVar5 = Regexp::parse_flags(r1);
        PVar5 = operator&(PVar5,NonGreedy);
        PVar6 = Regexp::parse_flags(r2);
        PVar6 = operator&(PVar6,NonGreedy);
        if (PVar5 == PVar6) {
          return true;
        }
      }
    }
    ppRVar7 = Regexp::sub(r1);
    bVar2 = Regexp::Equal(*ppRVar7,r2);
    if (bVar2) {
      return true;
    }
    ppRVar7 = Regexp::sub(r1);
    RVar3 = Regexp::op(*ppRVar7);
    if ((RVar3 == kRegexpLiteral) && (RVar3 = Regexp::op(r2), RVar3 == kRegexpLiteralString)) {
      pRVar8 = Regexp::runes(r2);
      iVar1 = *pRVar8;
      ppRVar7 = Regexp::sub(r1);
      RVar4 = Regexp::rune(*ppRVar7);
      if (iVar1 == RVar4) {
        ppRVar7 = Regexp::sub(r1);
        PVar5 = Regexp::parse_flags(*ppRVar7);
        PVar5 = operator&(PVar5,FoldCase);
        PVar6 = Regexp::parse_flags(r2);
        PVar6 = operator&(PVar6,FoldCase);
        if (PVar5 == PVar6) {
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

bool CoalesceWalker::CanCoalesce(Regexp* r1, Regexp* r2) {
  // r1 must be a star/plus/quest/repeat of a literal, char class, any char or
  // any byte.
  if ((r1->op() == kRegexpStar ||
       r1->op() == kRegexpPlus ||
       r1->op() == kRegexpQuest ||
       r1->op() == kRegexpRepeat) &&
      (r1->sub()[0]->op() == kRegexpLiteral ||
       r1->sub()[0]->op() == kRegexpCharClass ||
       r1->sub()[0]->op() == kRegexpAnyChar ||
       r1->sub()[0]->op() == kRegexpAnyByte)) {
    // r2 must be a star/plus/quest/repeat of the same literal, char class,
    // any char or any byte.
    if ((r2->op() == kRegexpStar ||
         r2->op() == kRegexpPlus ||
         r2->op() == kRegexpQuest ||
         r2->op() == kRegexpRepeat) &&
        Regexp::Equal(r1->sub()[0], r2->sub()[0]) &&
        // The parse flags must be consistent.
        ((r1->parse_flags() & Regexp::NonGreedy) ==
         (r2->parse_flags() & Regexp::NonGreedy))) {
      return true;
    }
    // ... OR an occurrence of that literal, char class, any char or any byte
    if (Regexp::Equal(r1->sub()[0], r2)) {
      return true;
    }
    // ... OR a literal string that begins with that literal.
    if (r1->sub()[0]->op() == kRegexpLiteral &&
        r2->op() == kRegexpLiteralString &&
        r2->runes()[0] == r1->sub()[0]->rune() &&
        // The parse flags must be consistent.
        ((r1->sub()[0]->parse_flags() & Regexp::FoldCase) ==
         (r2->parse_flags() & Regexp::FoldCase))) {
      return true;
    }
  }
  return false;
}